

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::fresnel::sgd::eval(sgd *this,float_t zd)

{
  bool bVar1;
  float *extraout_RDX;
  long in_RSI;
  __type _Var2;
  value_type vVar3;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  _Var4;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  _Var5;
  value_type local_ac;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  local_a8;
  float local_94;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>,_float>
  local_90;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  local_78;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_float>
  local_68;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_Expr,_std::_Expr,_std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_ValArray,_float,_float>_>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>,_float>
  local_50;
  float_t local_20;
  float_t local_1c;
  float_t c;
  float_t zd_local;
  sgd *this_local;
  
  bVar1 = false;
  if ((0.0 <= zd) && (bVar1 = false, zd <= 1.0)) {
    bVar1 = true;
  }
  local_1c = zd;
  this_local = this;
  if (!bVar1) {
    __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/plot-brdf/dj_brdf.h"
                  ,0x493,"virtual brdf::value_type djb::fresnel::sgd::eval(float_t) const");
  }
  local_20 = zd;
  _Var4 = std::operator*(&local_20,(valarray<float> *)(in_RSI + 0x18));
  local_78._M_closure.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr2 =
       _Var4._M_closure.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr2;
  local_78._M_closure.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr1 =
       _Var4._M_closure.super__BinBase1<std::__multiplies,_std::valarray<float>_>._M_expr1;
  std::operator-(&local_68,(valarray<float> *)(in_RSI + 8),&local_78);
  _Var2 = std::pow<float,int>(1.0 - local_20,5);
  local_94 = (float)_Var2;
  local_ac = 1.0;
  _Var5 = std::operator-(&local_ac,(valarray<float> *)(in_RSI + 8));
  local_a8._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2 =
       _Var5._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2;
  local_a8._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1 =
       _Var5._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1;
  std::operator*(&local_90,&local_94,&local_a8);
  std::operator+(&local_50,&local_68,&local_90);
  std::valarray<float>::
  valarray<std::__detail::_BinClos<std::__plus,std::_Expr,std::_Expr,std::__detail::_BinClos<std::__minus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_ValArray,float,float>>,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_Expr,float,std::__detail::_BinClos<std::__minus,std::_Constant,std::_ValArray,float,float>>>>
            ((valarray<float> *)this,&local_50);
  vVar3._M_data = extraout_RDX;
  vVar3._M_size = (size_t)this;
  return vVar3;
}

Assistant:

brdf::value_type sgd::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c = zd;

	return f0 - c * f1 + pow(1 - c, 5) * ((float_t)1 - f0);
}